

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O2

QString * __thiscall
QtMWidgets::Section::value(QString *__return_storage_ptr__,Section *this,QDateTime *dt)

{
  Type TVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  QLatin1String latin1;
  QString v;
  
  v.d.size = 0;
  v.d.d = (Data *)0x0;
  v.d.ptr = (char16_t *)0x0;
  TVar1 = this->type;
  switch(TVar1) {
  case AmPmSection:
    QDateTime::time();
    iVar2 = QTime::hour();
    if (iVar2 < 0xd) {
LAB_00181e08:
      QDateTime::time();
      iVar2 = QTime::hour();
      if (iVar2 == 0) goto LAB_00181f7e;
      pcVar4 = "AM";
    }
    else {
      QDateTime::time();
      iVar2 = QTime::hour();
      if (0x17 < iVar2) goto LAB_00181e08;
LAB_00181f7e:
      pcVar4 = "PM";
    }
    latin1.m_data = pcVar4;
    latin1.m_size = 2;
    QString::QString(__return_storage_ptr__,latin1);
    goto LAB_00181f67;
  case SecondSection:
    QDateTime::time();
    iVar2 = QTime::second();
    makeSectionValue(&v,iVar2,this->zeroesAdded);
    break;
  case SecondSection|AmPmSection:
  case MinuteSection|AmPmSection:
  case MinuteSection|SecondSection:
  case MinuteSection|SecondSection|AmPmSection:
    break;
  case MinuteSection:
    QDateTime::time();
    iVar2 = QTime::minute();
    makeSectionValue(&v,iVar2,this->zeroesAdded);
    break;
  case Hour12Section:
    QDateTime::time();
    iVar3 = QTime::hour();
    iVar2 = 0xc;
    if (iVar3 != 0) {
      iVar2 = iVar3;
    }
    if (0xc < iVar3) {
      iVar2 = iVar3 + -0xc;
    }
    makeSectionValue(&v,iVar2,this->zeroesAdded);
    break;
  default:
    if (TVar1 == Hour24Section) {
      QDateTime::time();
      iVar2 = QTime::hour();
      makeSectionValue(&v,iVar2,this->zeroesAdded);
    }
    else if (((TVar1 == DaySection) || (TVar1 == DaySectionShort)) || (TVar1 == DaySectionLong)) {
      QDateTime::date();
      iVar2 = QDate::day();
      makeSectionValue(&v,iVar2,this->zeroesAdded);
    }
    else if (TVar1 == MonthSection) {
      QDateTime::date();
      iVar2 = QDate::month();
      makeSectionValue(&v,iVar2,this->zeroesAdded);
    }
    else if (TVar1 == YearSection) {
      QDateTime::date();
      iVar2 = QDate::year();
      makeSectionValue(&v,iVar2,this->zeroesAdded);
    }
    else if (TVar1 == YearSection2Digits) {
      QDateTime::date();
      iVar2 = QDate::year();
      makeSectionValue(&v,iVar2,this->zeroesAdded);
      QString::right((longlong)__return_storage_ptr__);
      goto LAB_00181f67;
    }
  }
  QString::QString(__return_storage_ptr__,&v);
LAB_00181f67:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&v.d);
  return __return_storage_ptr__;
}

Assistant:

QString
Section::value( const QDateTime & dt ) const
{
	QString v;

	switch( type )
	{
		case AmPmSection :
			if( ( dt.time().hour() > 12 && dt.time().hour() <= 23 ) ||
				dt.time().hour() == 0 )
					return QLatin1String( "PM" );
			else
				return QLatin1String( "AM" );
		break;

		case SecondSection :
		{
			makeSectionValue( v, dt.time().second(), zeroesAdded );
			return v;
		}
		break;

		case MinuteSection :
		{
			makeSectionValue( v, dt.time().minute(), zeroesAdded );
			return v;
		}
		break;

		case Hour12Section :
		{
			int hour = dt.time().hour();

			if( hour > 12 )
				hour -= 12;
			else if( hour == 0 )
				hour = 12;

			makeSectionValue( v, hour, zeroesAdded );

			return v;
		}
		break;

		case Hour24Section :
		{
			makeSectionValue( v, dt.time().hour(), zeroesAdded );
			return v;
		}
		break;

		case DaySection :
		case DaySectionShort :
		case DaySectionLong :
		{
			makeSectionValue( v, dt.date().day(), zeroesAdded );
			return v;
		}
		break;

		case MonthSection :
		{
			makeSectionValue( v, dt.date().month(), zeroesAdded );
			return v;
		}
		break;

		case MonthSectionShort :
		case MonthSectionLong :
			return v;
		break;

		case YearSection :
		{
			makeSectionValue( v, dt.date().year(), zeroesAdded );
			return v;
		}
		break;

		case YearSection2Digits :
		{
			makeSectionValue( v, dt.date().year(), zeroesAdded );
			return v.right( 2 );
		}
		break;

		default :
			return v;
		break;
	}

	return v;
}